

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_SpawnMissileZ
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double z;
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  AActor *pAVar4;
  PClassActor *pPVar5;
  PClassActor *type;
  char *pcVar6;
  AActor *dest;
  bool bVar7;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_0043090e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004308ec:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043090e:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198a,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_00430768;
    pPVar2 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar7 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar3 && bVar7) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar7 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar3) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043090e;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_004308ec;
LAB_00430768:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_00430936:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198b,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_00430936;
  }
  if (numparam < 3) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_00430955;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_004308f5:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00430955;
  }
  z = param[1].field_0.f;
  dest = (AActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (dest == (AActor *)0x0) goto LAB_004307bc;
LAB_004307d7:
    pPVar2 = AActor::RegistrationInfo.MyClass;
    pPVar3 = (dest->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
      (dest->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar2 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar2) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00430955:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x198c,
                    "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (dest != (AActor *)0x0) goto LAB_004308f5;
LAB_004307bc:
    NullParam("\"dest\"");
    dest = (AActor *)param[2].field_0.field_1.a;
    if (dest != (AActor *)0x0) goto LAB_004307d7;
    dest = (AActor *)0x0;
  }
  if (numparam == 3) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_00430974;
  }
  if (param[3].field_0.field_3.Type != '\x03') {
LAB_004308fe:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430974:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198d,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  type = (PClassActor *)param[3].field_0.field_1.a;
  if (param[3].field_0.field_1.atag == 1) {
    if (type != (PClassActor *)0x0) {
      pPVar5 = type;
      if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
          if (pPVar5 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar5 != (PClassActor *)0x0);
        if (pPVar5 == (PClassActor *)0x0) {
          pcVar6 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_00430974;
        }
      }
      goto LAB_004308b0;
    }
  }
  else if (type != (PClassActor *)0x0) goto LAB_004308fe;
  type = (PClassActor *)0x0;
LAB_004308b0:
  pAVar4 = P_SpawnMissileZ(pAVar4,z,dest,type);
  if (numret < 1) {
    iVar1 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x198e,
                    "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = 1;
    VMReturn::SetPointer(ret,pAVar4,1);
  }
  return iVar1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileZ(self, z, dest, type));
}